

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Detail::
BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::setFlag(BoundBinaryFunction<Catch::ConfigData,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *this,ConfigData *obj)

{
  undefined8 in_RSI;
  long in_RDI;
  type value;
  string *this_00;
  undefined1 in_stack_ffffffffffffffc7;
  string local_30 [32];
  undefined8 local_10;
  
  this_00 = local_30;
  local_10 = in_RSI;
  std::__cxx11::string::string(this_00);
  convertInto<std::__cxx11::string>
            ((bool)in_stack_ffffffffffffffc7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  (**(code **)(in_RDI + 8))(local_10,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

virtual void setFlag( C& obj ) const {
                typename RemoveConstRef<T>::type value;
                convertInto( true, value );
                function( obj, value );
            }